

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdateVisibleFlag(ImGuiDockNode *node)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0;
  uVar2 = 0;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    uVar2 = *(uint *)&node->ChildNodes[0]->field_0xb8 >> 9 & 1;
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    uVar1 = *(uint *)&node->ChildNodes[1]->field_0xb8 >> 9 & 1;
  }
  *(ushort *)&node->field_0xb8 =
       (ushort)*(undefined4 *)&node->field_0xb8 & 0xfdff |
       (ushort)((uVar1 | uVar2 |
                (uint)(0 < (node->Windows).Size ||
                      (node->LocalFlags &
                      (uint)(node->ParentNode != (ImGuiDockNode *)0x0) * 0x400 + 0x400) != 0)) << 9)
  ;
  return;
}

Assistant:

static void ImGui::DockNodeUpdateVisibleFlag(ImGuiDockNode* node)
{
    // Update visibility flag
    bool is_visible = (node->ParentNode == NULL) ? node->IsDockSpace() : node->IsCentralNode();
    is_visible |= (node->Windows.Size > 0);
    is_visible |= (node->ChildNodes[0] && node->ChildNodes[0]->IsVisible);
    is_visible |= (node->ChildNodes[1] && node->ChildNodes[1]->IsVisible);
    node->IsVisible = is_visible;
}